

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O1

void __thiscall irr::video::CNullDriver::deleteShaderMaterial(CNullDriver *this,s32 material)

{
  code *pcVar1;
  int *piVar2;
  pointer pSVar3;
  _func_int *p_Var4;
  long lVar5;
  IMaterialRenderer *pIVar6;
  uint uVar7;
  
  if (4 < (uint)material) {
    pSVar3 = (this->MaterialRenderers).m_data.
             super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = (int)((ulong)((long)(this->MaterialRenderers).m_data.
                                super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3) >> 3) *
            -0x33333333;
    if ((uint)material < uVar7) {
      if (uVar7 - 1 == material) {
        pIVar6 = pSVar3[(uint)material].Renderer;
        if (pIVar6 != (IMaterialRenderer *)0x0) {
          p_Var4 = pIVar6->_vptr_IMaterialRenderer[0xfffffffffffffffd];
          pcVar1 = (code *)(&pIVar6->field_0x10 + (long)p_Var4);
          *(int *)pcVar1 = *(int *)pcVar1 + -1;
          if (*(int *)pcVar1 == 0) {
            (**(code **)(*(long *)((long)&pIVar6->_vptr_IMaterialRenderer + (long)p_Var4) + 8))();
          }
        }
        std::
        vector<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
        ::_M_erase(&(this->MaterialRenderers).m_data,
                   (this->MaterialRenderers).m_data.
                   super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
                   ._M_impl.super__Vector_impl_data._M_start + (uint)material);
        return;
      }
      pSVar3 = pSVar3 + (uint)material;
      pIVar6 = pSVar3->Renderer;
      if (pIVar6 != (IMaterialRenderer *)0x0) {
        lVar5 = *(long *)((long)pIVar6->_vptr_IMaterialRenderer + -0x18);
        piVar2 = (int *)((long)&pIVar6->field_0x10 + lVar5);
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          (**(code **)(*(long *)((long)&pIVar6->_vptr_IMaterialRenderer + lVar5) + 8))();
        }
      }
      pIVar6 = (IMaterialRenderer *)operator_new(0x20);
      *(undefined8 *)&pIVar6->field_0x10 = 0;
      *(undefined4 *)&pIVar6->field_0x18 = 1;
      pIVar6->_vptr_IMaterialRenderer = (_func_int **)0x266460;
      *(undefined8 *)&pIVar6->field_0x8 = 0x2664b8;
      pSVar3->Renderer = pIVar6;
      core::string<char>::clear(&pSVar3->Name,true);
      return;
    }
  }
  return;
}

Assistant:

void CNullDriver::deleteShaderMaterial(s32 material)
{
	const u32 idx = (u32)material;
	if (idx < numBuiltInMaterials || idx >= MaterialRenderers.size())
		return;

	// if this is the last material we can drop it without consequence
	if (idx == MaterialRenderers.size() - 1) {
		if (MaterialRenderers[idx].Renderer)
			MaterialRenderers[idx].Renderer->drop();
		MaterialRenderers.erase(idx);
		return;
	}
	// otherwise replace with a dummy renderer, we have to preserve the IDs
	auto &ref = MaterialRenderers[idx];
	if (ref.Renderer)
		ref.Renderer->drop();
	ref.Renderer = new CDummyMaterialRenderer();
	ref.Name.clear();
}